

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status fdb_check_file_reopen(fdb_kvs_handle *handle,file_status_t *status)

{
  file_status_t fVar1;
  fdb_file_handle *pfVar2;
  filemgr *pfVar3;
  uint64_t version;
  long lVar4;
  bool bVar5;
  fdb_status fVar6;
  fdb_filename_mode_t filename_mode;
  char *pcVar7;
  long alStack_5d0 [9];
  char local_588 [8];
  char filename [1024];
  fdb_config config;
  uint64_t ndocs;
  uint64_t ndeletes;
  uint64_t datasize;
  uint64_t nlivenodes;
  uint64_t last_wal_flush_hdr_bid;
  uint64_t kv_info_offset;
  uint64_t header_flags;
  size_t header_len;
  bid_t trie_root_bid;
  bid_t seq_root_bid;
  bid_t stale_root_bid;
  char *new_filename;
  
  fVar1 = (handle->file->status).super___atomic_base<unsigned_char>._M_i;
  if ((fVar1 == '\x04') && ((handle->config).do_not_move_to_compacted_file == false)) {
    lVar4 = -((ulong)(handle->config).blocksize + 0xf & 0xfffffffffffffff0);
    *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11b5a6;
    memcpy(filename + 0x3f8,&handle->config,0xf8);
    if ((handle->config).compaction_mode == '\x01') {
      pcVar7 = handle->filename;
      *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11b5c3;
      strcpy(local_588,pcVar7);
      pfVar2 = handle->fhandle;
      pfVar3 = handle->file;
      *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11b5d0;
      bVar5 = filemgr_fhandle_remove(pfVar3,pfVar2);
      *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11b5db;
      fVar6 = _fdb_close(handle);
      if (fVar6 != FDB_RESULT_SUCCESS) {
LAB_0011b681:
        if (bVar5 == false) {
          return fVar6;
        }
        pfVar2 = handle->fhandle;
        pfVar3 = handle->file;
        *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11b69a;
        filemgr_fhandle_add(pfVar3,pfVar2);
        return fVar6;
      }
      filename_mode = FDB_VFILENAME;
      pcVar7 = local_588;
    }
    else {
      pfVar3 = handle->file;
      *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11b613;
      filemgr_get_header(pfVar3,local_588 + lVar4,&header_flags,(bid_t *)0x0,(fdb_seqnum_t *)0x0,
                         (filemgr_header_revnum_t *)0x0);
      version = handle->file->version;
      *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0;
      *(bid_t **)((long)alStack_5d0 + lVar4 + 0x38) = &stale_root_bid;
      *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x30) = &kv_info_offset;
      *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x28) = &last_wal_flush_hdr_bid;
      *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x20) = &nlivenodes;
      *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x18) = &ndeletes;
      *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x10) = &datasize;
      *(uint64_t **)((long)alStack_5d0 + lVar4 + 8) = &ndocs;
      *(undefined8 *)((long)alStack_5d0 + lVar4) = 0x11b661;
      fdb_fetch_header(version,local_588 + lVar4,&header_len,&trie_root_bid,&seq_root_bid,
                       (uint64_t *)&config.num_blocks_readahead,
                       *(uint64_t **)((long)alStack_5d0 + lVar4 + 8),
                       *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x10),
                       *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x18),
                       *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x20),
                       *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x28),
                       *(uint64_t **)((long)alStack_5d0 + lVar4 + 0x30),
                       *(char ***)((long)alStack_5d0 + lVar4 + 0x38),
                       *(char ***)((long)alStack_5d0 + lVar4 + 0x40));
      pfVar2 = handle->fhandle;
      pfVar3 = handle->file;
      *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11b672;
      bVar5 = filemgr_fhandle_remove(pfVar3,pfVar2);
      *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11b67d;
      fVar6 = _fdb_close(handle);
      if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_0011b681;
      filename_mode = FDB_AFILENAME;
      pcVar7 = (char *)stale_root_bid;
    }
    *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11b6b7;
    fVar6 = _fdb_open(handle,pcVar7,filename_mode,(fdb_config *)(filename + 0x3f8));
    if (fVar6 != FDB_RESULT_SUCCESS) {
      return fVar6;
    }
    pfVar2 = handle->fhandle;
    pfVar3 = handle->file;
    *(undefined8 *)((long)alStack_5d0 + lVar4 + 0x40) = 0x11b6cf;
    filemgr_fhandle_add(pfVar3,pfVar2);
  }
  if (status != (file_status_t *)0x0) {
    *status = fVar1;
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status fdb_check_file_reopen(fdb_kvs_handle *handle, file_status_t *status)
{
    bool fhandle_ret;
    fdb_status fs = FDB_RESULT_SUCCESS;
    file_status_t fstatus = filemgr_get_file_status(handle->file);
    // check whether the compaction is done
    if ( fstatus == FILE_REMOVED_PENDING &&
         !handle->config.do_not_move_to_compacted_file ) {
        uint64_t ndocs, ndeletes, datasize, nlivenodes, last_wal_flush_hdr_bid;
        uint64_t kv_info_offset, header_flags;
        size_t header_len;
        char *new_filename;
        uint8_t *buf = alca(uint8_t, handle->config.blocksize);
        bid_t trie_root_bid, seq_root_bid, stale_root_bid;
        fdb_config config = handle->config;

        // close the current file and newly open the new file
        if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
            // compaction daemon mode .. just close and then open
            char filename[FDB_MAX_FILENAME_LEN];
            strcpy(filename, handle->filename);

            // We don't need to maintain fhandle list for the old file
            // as there will be no more mutation on the file.
            fhandle_ret = filemgr_fhandle_remove(handle->file, handle->fhandle);
            fs = _fdb_close(handle);
            if (fs != FDB_RESULT_SUCCESS) {
                if (fhandle_ret) {
                    filemgr_fhandle_add(handle->file, handle->fhandle);
                }
                return fs;
            }

            fs = _fdb_open(handle, filename, FDB_VFILENAME, &config);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
            filemgr_fhandle_add(handle->file, handle->fhandle);

        } else {
            // Manual compaction.
            filemgr_get_header(handle->file, buf, &header_len, NULL, NULL, NULL);
            fdb_fetch_header(handle->file->version, buf,
                             &trie_root_bid, &seq_root_bid, &stale_root_bid,
                             &ndocs, &ndeletes, &nlivenodes, &datasize,
                             &last_wal_flush_hdr_bid,
                             &kv_info_offset, &header_flags,
                             &new_filename, NULL);

            fhandle_ret = filemgr_fhandle_remove(handle->file, handle->fhandle);
            fs = _fdb_close(handle);
            if (fs != FDB_RESULT_SUCCESS) {
                if (fhandle_ret) {
                    filemgr_fhandle_add(handle->file, handle->fhandle);
                }
                return fs;
            }

            fs = _fdb_open(handle, new_filename, FDB_AFILENAME, &config);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
            filemgr_fhandle_add(handle->file, handle->fhandle);
        }
    }
    if (status) {
        *status = fstatus;
    }
    return fs;
}